

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O1

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void>::
eval_exc_vxc_<int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinPBE_X,void> *this,int *args,double **args_1,
          double **args_2,double **args_3,double **args_4,double **args_5)

{
  double __x;
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  host_buffer_type eps;
  host_buffer_type vrho;
  host_buffer_type vsigma;
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  double dVar12;
  
  N = *args;
  rho = *args_1;
  sigma = *args_2;
  eps = *args_3;
  vrho = *args_4;
  vsigma = *args_5;
  if (*(int *)(this + 8) == 0) {
    host_eval_exc_vxc_helper_polar<ExchCXX::BuiltinPBE_X>(N,rho,sigma,eps,vrho,vsigma);
    return;
  }
  if (0 < (int)N) {
    uVar1 = 0;
    do {
      __x = rho[uVar1];
      if (__x <= 1e-32) {
        eps[uVar1] = 0.0;
        vrho[uVar1] = 0.0;
        dVar6 = 0.0;
      }
      else {
        dVar6 = sigma[uVar1];
        dVar9 = 4.64158883361283e-86;
        if (4.64158883361283e-86 <= dVar6) {
          dVar9 = dVar6;
        }
        dVar2 = __x * 0.5;
        dVar3 = cbrt(1.0);
        dVar4 = cbrt(__x);
        auVar10._0_8_ = (dVar3 * -0.9847450218426964) / dVar4;
        auVar10._8_8_ = 0x3ff0000000000000;
        dVar8 = __x * __x;
        dVar6 = (((1.0 / (dVar4 * dVar4)) / dVar8) *
                dVar9 * 0.08669247488762274 * 1.5874010519681996) / 24.0 + 0.804;
        dVar5 = (1.0 - 0.804 / dVar6) * 0.804 + 1.0;
        auVar11._8_8_ = dVar6 * dVar6;
        auVar11._0_8_ = dVar8;
        auVar11 = divpd(auVar10,auVar11);
        dVar12 = auVar11._8_8_ * 0.2195149727645171;
        dVar7 = 0.0;
        if (1e-32 < dVar2) {
          dVar7 = ((dVar3 * -0.9847450218426964) / (dVar4 * dVar4)) * dVar5 * 0.125 +
                  ((((dVar3 * 0.9847450218426964) / dVar4) / (__x * dVar8)) * 0.6464160000000001 *
                  dVar9 * 0.21733691746289932 * 1.5874010519681996 * dVar12 * 1.8171205928321397) /
                  24.0;
        }
        dVar6 = 0.0;
        if (1e-32 < dVar2) {
          dVar6 = auVar11._0_8_ * 0.6464160000000001 * dVar12 * 0.6269081516456065 * 0.015625;
        }
        dVar5 = dVar3 * -0.36927938319101117 * dVar4 * dVar5;
        dVar9 = (double)(~-(ulong)(dVar2 <= 1e-32) & (ulong)(dVar5 + dVar5));
        eps[uVar1] = dVar9;
        vrho[uVar1] = dVar7 * (__x + __x) + dVar9;
        dVar6 = (__x + __x) * dVar6;
      }
      vsigma[uVar1] = dVar6;
      uVar1 = uVar1 + 1;
    } while (N != uVar1);
  }
  return;
}

Assistant:

void eval_exc_vxc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }